

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O2

void __thiscall cmComputeLinkDepends::LinkEntry::~LinkEntry(LinkEntry *this)

{
  std::__cxx11::string::~string((string *)&this->Feature);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&this->Item);
  return;
}

Assistant:

LinkEntry() = default;